

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

bool __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
::has_next(Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
           *this,bool all_cofacets)

{
  long *plVar1;
  simplex_t *psVar2;
  char k;
  pointer prVar3;
  pointer prVar4;
  pointer piVar5;
  vertex_diameter_t *pvVar6;
  simplex_t sVar7;
  byte bVar8;
  simplex_t *psVar9;
  simplex_t *psVar10;
  long extraout_RDX;
  long extraout_RDX_00;
  byte bVar11;
  ulong uVar12;
  vertex_diameter_t *pvVar13;
  ulong uVar14;
  bool bVar15;
  vertex_t vVar16;
  vertex_diameter_t *pvVar17;
  value_t vVar18;
  
  prVar3 = (this->neighbor_it).
           super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar4 = (this->neighbor_end).
           super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar13 = (prVar3->current)._M_current;
  if (pvVar13 == (prVar4->current)._M_current) {
    bVar11 = 0;
LAB_00125553:
    bVar15 = false;
  }
  else {
    uVar12 = (long)(this->neighbor_it).
                   super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)prVar3 >> 3;
    bVar11 = 0;
    do {
      vVar16 = pvVar13[-1].i;
      (this->neighbor).i = vVar16;
      vVar18 = pvVar13[-1].d;
      (this->neighbor).d = vVar18;
      if (uVar12 < 2) {
LAB_00125560:
        bVar8 = this->k;
        bVar11 = 1;
        if ((char)bVar8 < '\x01') goto LAB_001255d6;
        goto LAB_0012556e;
      }
      uVar14 = 1;
      while( true ) {
        pvVar13 = prVar4[uVar14].current._M_current;
        pvVar6 = prVar3[uVar14].current._M_current;
        while( true ) {
          pvVar17 = pvVar6 + -1;
          if (pvVar17->i <= vVar16) break;
          prVar3[uVar14].current._M_current = pvVar17;
          pvVar6 = pvVar17;
          if (pvVar17 == pvVar13) {
            bVar11 = 1;
            goto LAB_00125553;
          }
        }
        if (pvVar17->i != vVar16) break;
        if (pvVar6[-1].d <= vVar18) {
          pvVar17 = &this->neighbor;
        }
        vVar16 = pvVar17->i;
        (this->neighbor).i = vVar16;
        vVar18 = pvVar17->d;
        (this->neighbor).d = vVar18;
        uVar14 = uVar14 + 1;
        if (uVar14 == uVar12) goto LAB_00125560;
      }
      pvVar13 = (prVar3->current)._M_current + -1;
      (prVar3->current)._M_current = pvVar13;
      bVar15 = false;
    } while (pvVar13 != (prVar4->current)._M_current);
  }
  goto LAB_00125556;
  while( true ) {
    psVar9 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                       ((simplex_t *)this->simplex_encoding,
                        (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                        (ulong)(uint)piVar5[(ulong)bVar8 - 1],(int)(char)bVar8,(dimension_t)piVar5);
    psVar10 = *(simplex_t **)&this->idx_below;
    *(long *)&this->idx_below = (long)this->idx_below - (long)psVar9;
    plVar1 = (long *)((long)&this->idx_below + 8);
    *plVar1 = (*plVar1 - extraout_RDX) - (ulong)(psVar10 < psVar9);
    k = this->k;
    psVar10 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                        ((simplex_t *)this->simplex_encoding,
                         (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                         (ulong)(uint)(this->vertices).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[(long)k + -1],
                         (int)(char)(k + '\x01'),k);
    psVar2 = &this->idx_above;
    sVar7 = *psVar2;
    *(long *)psVar2 = (long)*psVar2 + (long)psVar10;
    plVar1 = (long *)((long)&this->idx_above + 8);
    *plVar1 = *plVar1 + extraout_RDX_00 + (ulong)CARRY8((ulong)sVar7,(ulong)psVar10);
    bVar8 = this->k - 1;
    this->k = bVar8;
    if ((char)bVar8 < '\x01') break;
LAB_0012556e:
    piVar5 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar15 = piVar5[bVar8 - 1] <= (this->neighbor).i;
    if (bVar15 || !all_cofacets) goto LAB_00125556;
  }
LAB_001255d6:
  bVar15 = true;
LAB_00125556:
  return (bool)(bVar11 & bVar15);
}

Assistant:

bool has_next(bool all_cofacets = true) {
      for (auto &it0 = neighbor_it[0], &end0 = neighbor_end[0]; it0 != end0; ++it0) {
        neighbor = *it0;
        for (size_t idx = 1; idx < neighbor_it.size(); ++idx) {
          auto &it = neighbor_it[idx], end = neighbor_end[idx];
          while (get_vertex(*it) > get_vertex(neighbor))
            if (++it == end) return false;
          if (get_vertex(*it) != get_vertex(neighbor))
            goto continue_outer;
          else
            neighbor = std::max(neighbor, *it);
        }
        while (k > 0 && vertices[k - 1] > get_vertex(neighbor)) {
          if (!all_cofacets) return false;
          idx_below -= simplex_encoding(vertices[k - 1], k);
          idx_above += simplex_encoding(vertices[k - 1], k + 1);
          --k;
        }
        return true;
continue_outer:;
      }
      return false;
    }